

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_1::RboInternalFormatCase::test(RboInternalFormatCase *this)

{
  CallLogWrapper *this_00;
  GLenum internalformat;
  long lVar1;
  GLuint renderbufferID;
  GLuint local_2c;
  
  local_2c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&local_2c);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,local_2c);
  lVar1 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8d44,0x8056);
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    internalformat = *(GLenum *)((long)&DAT_01bcc5a4 + lVar1);
    glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,internalformat,1,1);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8d44,internalformat);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&local_2c);
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RGBA4);
		expectError(GL_NO_ERROR);

		const GLenum requiredColorformats[] =
		{
			GL_RGBA4, GL_RGB5_A1, GL_RGB565
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredColorformats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredColorformats[ndx], 1, 1);
			expectError(GL_NO_ERROR);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_INTERNAL_FORMAT, requiredColorformats[ndx]);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}